

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableEnumOneofFieldLiteGenerator::GenerateFieldInfo
          (ImmutableEnumOneofFieldLiteGenerator *this,Printer *printer,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *output)

{
  FieldDescriptor *descriptor;
  bool bVar1;
  int iVar2;
  OneofDescriptor *this_00;
  char *pcVar3;
  int __c;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__s;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *output_local;
  Printer *printer_local;
  ImmutableEnumOneofFieldLiteGenerator *this_local;
  
  iVar2 = FieldDescriptor::number((this->super_ImmutableEnumFieldLiteGenerator).descriptor_);
  WriteIntToUtf16CharSequence(iVar2,output);
  iVar2 = GetExperimentalJavaFieldType((this->super_ImmutableEnumFieldLiteGenerator).descriptor_);
  __s = output;
  WriteIntToUtf16CharSequence(iVar2,output);
  this_00 = FieldDescriptor::containing_oneof
                      ((this->super_ImmutableEnumFieldLiteGenerator).descriptor_);
  pcVar3 = OneofDescriptor::index(this_00,(char *)__s,__c);
  WriteIntToUtf16CharSequence((int)pcVar3,output);
  bVar1 = SupportUnknownEnumValue((this->super_ImmutableEnumFieldLiteGenerator).descriptor_);
  if (!bVar1) {
    descriptor = (this->super_ImmutableEnumFieldLiteGenerator).descriptor_;
    bVar1 = Context::EnforceLite((this->super_ImmutableEnumFieldLiteGenerator).context_);
    PrintEnumVerifierLogic
              (printer,descriptor,&(this->super_ImmutableEnumFieldLiteGenerator).variables_,"$type$"
               ,",\n",bVar1);
  }
  return;
}

Assistant:

void ImmutableEnumOneofFieldLiteGenerator::GenerateFieldInfo(
    io::Printer* printer, std::vector<uint16_t>* output) const {
  WriteIntToUtf16CharSequence(descriptor_->number(), output);
  WriteIntToUtf16CharSequence(GetExperimentalJavaFieldType(descriptor_),
                              output);
  WriteIntToUtf16CharSequence(descriptor_->containing_oneof()->index(), output);
  if (!SupportUnknownEnumValue(descriptor_)) {
    PrintEnumVerifierLogic(printer, descriptor_, variables_,
                           /*var_name=*/"$type$",
                           /*terminating_string=*/",\n",
                           /*enforce_lite=*/context_->EnforceLite());
  }
}